

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::clear_bufferiv(NegativeTestContext *ctx)

{
  GLint drawbuffer;
  pointer piVar1;
  reference pvVar2;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  GLint local_48;
  GLuint local_44;
  int maxDrawBuffers;
  deUint32 texture;
  deUint32 fbo;
  allocator<int> local_29;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> data;
  NegativeTestContext *ctx_local;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)ctx;
  std::allocator<int>::allocator(&local_29);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,0x400,&local_29);
  std::allocator<int>::~allocator(&local_29);
  maxDrawBuffers = 0x1234;
  local_44 = 0x1234;
  local_48 = 0x1234;
  glu::CallLogWrapper::glGenTextures
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,1,&local_44);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0xde1,local_44);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0xde1,0,0x8d82,0x20,0x20,0,0x8d99,0x1404,(void *)0x0);
  glu::CallLogWrapper::glGenFramebuffers
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,1,(GLuint *)&maxDrawBuffers);
  glu::CallLogWrapper::glBindFramebuffer
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x8d40,maxDrawBuffers);
  glu::CallLogWrapper::glFramebufferTexture2D
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x8d40,0x8ce0,0xde1,local_44,0);
  glu::CallLogWrapper::glCheckFramebufferStatus
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x8d40);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_INVALID_ENUM is generated if buffer is not an accepted value.",
             &local_69);
  NegativeTestContext::beginSection((NegativeTestContext *)piVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0xffffffff,0,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x500);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x8d40,0,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x500);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "GL_INVALID_ENUM is generated if buffer is GL_DEPTH or GL_DEPTH_STENCIL.",&local_91);
  NegativeTestContext::beginSection((NegativeTestContext *)piVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x1801,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x500);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x84f9,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x500);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "GL_INVALID_VALUE is generated if buffer is GL_COLOR or GL_STENCIL and drawBuffer is greater than or equal to GL_MAX_DRAW_BUFFERS."
             ,&local_b9);
  NegativeTestContext::beginSection((NegativeTestContext *)piVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x8824,&local_48);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  drawbuffer = local_48;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x1800,drawbuffer,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x501);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "GL_INVALID_VALUE is generated if buffer is GL_COLOR or GL_STENCIL and drawBuffer is negative."
             ,&local_e1);
  NegativeTestContext::beginSection((NegativeTestContext *)piVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x1800,-1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x501);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "GL_INVALID_VALUE is generated if buffer is GL_STENCIL and drawBuffer is not zero.",
             &local_109);
  NegativeTestContext::beginSection((NegativeTestContext *)piVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28,0);
  glu::CallLogWrapper::glClearBufferiv((CallLogWrapper *)piVar1,0x1802,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x501);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  glu::CallLogWrapper::glDeleteFramebuffers
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,1,(GLuint *)&maxDrawBuffers);
  glu::CallLogWrapper::glDeleteTextures
            ((CallLogWrapper *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,1,&local_44);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void clear_bufferiv (NegativeTestContext& ctx)
{
	std::vector<int>	data			(32*32);
	deUint32			fbo				= 0x1234;
	deUint32			texture			= 0x1234;
	int					maxDrawBuffers	= 0x1234;

	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA32I, 32, 32, 0, GL_RGBA_INTEGER, GL_INT, NULL);
	ctx.glGenFramebuffers		(1, &fbo);
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
	ctx.glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if buffer is not an accepted value.");
	ctx.glClearBufferiv			(-1, 0, &data[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.glClearBufferiv			(GL_FRAMEBUFFER, 0, &data[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if buffer is GL_DEPTH or GL_DEPTH_STENCIL.");
	ctx.glClearBufferiv			(GL_DEPTH, 1, &data[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.glClearBufferiv			(GL_DEPTH_STENCIL, 1, &data[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if buffer is GL_COLOR or GL_STENCIL and drawBuffer is greater than or equal to GL_MAX_DRAW_BUFFERS.");
	ctx.glGetIntegerv			(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	ctx.glClearBufferiv			(GL_COLOR, maxDrawBuffers, &data[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if buffer is GL_COLOR or GL_STENCIL and drawBuffer is negative.");
	ctx.glClearBufferiv			(GL_COLOR, -1, &data[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if buffer is GL_STENCIL and drawBuffer is not zero.");
	ctx.glClearBufferiv			(GL_STENCIL, 1, &data[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteFramebuffers	(1, &fbo);
	ctx.glDeleteTextures		(1, &texture);
}